

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint pi;
  int iVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  char test [64];
  
  test[0x30] = '\0';
  test[0x31] = '\0';
  test[0x32] = '\0';
  test[0x33] = '\0';
  test[0x34] = '\0';
  test[0x35] = '\0';
  test[0x36] = '\0';
  test[0x37] = '\0';
  test[0x38] = '\0';
  test[0x39] = '\0';
  test[0x3a] = '\0';
  test[0x3b] = '\0';
  test[0x3c] = '\0';
  test[0x3d] = '\0';
  test[0x3e] = '\0';
  test[0x3f] = '\0';
  test[0x20] = '\0';
  test[0x21] = '\0';
  test[0x22] = '\0';
  test[0x23] = '\0';
  test[0x24] = '\0';
  test[0x25] = '\0';
  test[0x26] = '\0';
  test[0x27] = '\0';
  test[0x28] = '\0';
  test[0x29] = '\0';
  test[0x2a] = '\0';
  test[0x2b] = '\0';
  test[0x2c] = '\0';
  test[0x2d] = '\0';
  test[0x2e] = '\0';
  test[0x2f] = '\0';
  test[0x10] = '\0';
  test[0x11] = '\0';
  test[0x12] = '\0';
  test[0x13] = '\0';
  test[0x14] = '\0';
  test[0x15] = '\0';
  test[0x16] = '\0';
  test[0x17] = '\0';
  test[0x18] = '\0';
  test[0x19] = '\0';
  test[0x1a] = '\0';
  test[0x1b] = '\0';
  test[0x1c] = '\0';
  test[0x1d] = '\0';
  test[0x1e] = '\0';
  test[0x1f] = '\0';
  test[0] = '\0';
  test[1] = '\0';
  test[2] = '\0';
  test[3] = '\0';
  test[4] = '\0';
  test[5] = '\0';
  test[6] = '\0';
  test[7] = '\0';
  test[8] = '\0';
  test[9] = '\0';
  test[10] = '\0';
  test[0xb] = '\0';
  test[0xc] = '\0';
  test[0xd] = '\0';
  test[0xe] = '\0';
  test[0xf] = '\0';
  if (argc < 2) {
    sVar2 = strlen(test);
    builtin_strncpy(test + sVar2,"0123456789",0xb);
  }
  else {
    pcVar6 = argv[1];
    uVar8 = 0;
    lVar7 = 0;
    while( true ) {
      sVar2 = strlen(pcVar6);
      if (sVar2 <= uVar8) break;
      pp_Var3 = __ctype_tolower_loc();
      iVar1 = (*pp_Var3)[pcVar6[uVar8]];
      pcVar4 = strchr(test,iVar1);
      if (pcVar4 == (char *)0x0) {
        lVar5 = (long)(int)lVar7;
        lVar7 = lVar5 + 1;
        test[lVar5] = (char)iVar1;
        test[lVar5 + 1] = '\0';
      }
      uVar8 = uVar8 + 1;
    }
  }
  pi = pigpio_start(0,0);
  uVar8 = (ulong)pi;
  if ((int)pi < 0) {
    fprintf(_stderr,"pigpio initialisation failed (%d).\n",uVar8);
    iVar1 = 1;
  }
  else {
    printf("Connected to pigpio daemon (%d).\n",uVar8);
    pcVar6 = strchr(test,0x30);
    if (pcVar6 != (char *)0x0) {
      t0(pi);
    }
    pcVar6 = strchr(test,0x31);
    if (pcVar6 != (char *)0x0) {
      t1(pi);
    }
    pcVar6 = strchr(test,0x32);
    if (pcVar6 != (char *)0x0) {
      t2(pi);
    }
    pcVar6 = strchr(test,0x33);
    if (pcVar6 != (char *)0x0) {
      t3(pi);
    }
    pcVar6 = strchr(test,0x34);
    if (pcVar6 != (char *)0x0) {
      t4(pi);
    }
    pcVar6 = strchr(test,0x35);
    if (pcVar6 != (char *)0x0) {
      t5(pi);
    }
    pcVar6 = strchr(test,0x36);
    if (pcVar6 != (char *)0x0) {
      t6(pi);
    }
    pcVar6 = strchr(test,0x37);
    if (pcVar6 != (char *)0x0) {
      t7(pi);
    }
    pcVar6 = strchr(test,0x38);
    if (pcVar6 != (char *)0x0) {
      t8(pi);
    }
    pcVar6 = strchr(test,0x39);
    if (pcVar6 != (char *)0x0) {
      t9(pi);
    }
    pcVar6 = strchr(test,0x61);
    if (pcVar6 != (char *)0x0) {
      ta(pi);
    }
    pcVar6 = strchr(test,0x62);
    if (pcVar6 != (char *)0x0) {
      tb(pi);
    }
    pcVar6 = strchr(test,99);
    if (pcVar6 != (char *)0x0) {
      tc(pi);
    }
    pigpio_stop(uVar8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
   int i, t, c, pi;

   char test[64]={0,};

   if (argc > 1)
   {
      t = 0;

      for (i=0; i<strlen(argv[1]); i++)
      {
         c = tolower(argv[1][i]);

         if (!strchr(test, c))
         {
            test[t++] = c;
            test[t] = 0;
         }
      }
   }
   else strcat(test, "0123456789");

   pi = pigpio_start(0, 0);

   if (pi < 0)
   {
      fprintf(stderr, "pigpio initialisation failed (%d).\n", pi);
      return 1;
   }

   printf("Connected to pigpio daemon (%d).\n", pi);

   if (strchr(test, '0')) t0(pi);
   if (strchr(test, '1')) t1(pi);
   if (strchr(test, '2')) t2(pi);
   if (strchr(test, '3')) t3(pi);
   if (strchr(test, '4')) t4(pi);
   if (strchr(test, '5')) t5(pi);
   if (strchr(test, '6')) t6(pi);
   if (strchr(test, '7')) t7(pi);
   if (strchr(test, '8')) t8(pi);
   if (strchr(test, '9')) t9(pi);
   if (strchr(test, 'a')) ta(pi);
   if (strchr(test, 'b')) tb(pi);
   if (strchr(test, 'c')) tc(pi);

   pigpio_stop(pi);

   return 0;
}